

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidiin.cpp
# Opt level: O1

void anon_unknown.dwarf_124eb::RtMidiInCustomCallback
               (double timeStamp,vector<unsigned_char,_std::allocator<unsigned_char>_> *message,
               void *userData)

{
  pointer puVar1;
  pointer puVar2;
  iterator iVar3;
  long lVar4;
  ulong uVar5;
  
  iVar3 = std::
          _Rb_tree<std::pair<RtMidiIn_*,_lua_State_*>,_std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>,_std::_Select1st<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>,_std::less<std::pair<RtMidiIn_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>_>
          ::find((_Rb_tree<std::pair<RtMidiIn_*,_lua_State_*>,_std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>,_std::_Select1st<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>,_std::less<std::pair<RtMidiIn_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidiIn_*,_lua_State_*>,_int>_>_>
                  *)(anonymous_namespace)::RtMidiIn_callbacks,(key_type *)userData);
  if (iVar3._M_node == (_Base_ptr)((anonymous_namespace)::RtMidiIn_callbacks + 8)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"RtMidiIn instance not found!\n",0x1d);
  }
  puVar1 = (message->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (message->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lua_rawgeti(*(undefined8 *)((long)userData + 8),0xfff0b9d8,
              *(undefined4 *)&iVar3._M_node[1]._M_left);
  lua_pushnumber(timeStamp,*(undefined8 *)((long)userData + 8));
  lua_createtable(*(undefined8 *)((long)userData + 8),(long)puVar1 - (long)puVar2,0);
  lVar4 = (long)puVar1 - (long)puVar2;
  if (lVar4 != 0) {
    uVar5 = 0;
    do {
      lua_pushinteger(*(undefined8 *)((long)userData + 8),
                      (message->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start[uVar5]);
      uVar5 = uVar5 + 1;
      lua_rawseti(*(undefined8 *)((long)userData + 8),0xfffffffe,uVar5 & 0xffffffff);
    } while (lVar4 + (ulong)(lVar4 == 0) != uVar5);
  }
  lua_callk(*(undefined8 *)((long)userData + 8),2,0,0,0);
  return;
}

Assistant:

void RtMidiInCustomCallback(double timeStamp, std::vector<unsigned char> *message, void *userData) {
	auto *rec = reinterpret_cast<RtMidiIn_callback_rec *>(userData);
	auto it = RtMidiIn_callbacks.find(*rec);
	if (it == RtMidiIn_callbacks.end())
		std::cerr << "RtMidiIn instance not found!\n";
	auto n = message->size();

	lua_rawgeti(rec->second, LUA_REGISTRYINDEX, it->second); // RtMidiIn_callbackwrapper
	lua_pushnumber(rec->second, timeStamp);
	lua_createtable(rec->second, n, 0);
	for (std::size_t i = 0; i < n; ++i) {
		lua_pushinteger(rec->second, (*message)[i]);
		lua_rawseti(rec->second, -2, i + 1);
	}
	lua_call(rec->second, 2, 0);
}